

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cc
# Opt level: O0

void printStats(Solver *solver)

{
  unsigned_long uVar1;
  undefined8 uVar2;
  ulong uVar3;
  unsigned_long *puVar4;
  long in_RDI;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double mem_used;
  double cpu_time;
  float local_6c;
  float local_34;
  ulong local_28;
  
  dVar5 = Glucose::cpuTime();
  if (*(long *)(in_RDI + 0xe8) == 0) {
    local_28 = 0;
  }
  else {
    local_28 = *(ulong *)(in_RDI + 0x100) / *(ulong *)(in_RDI + 0xe8);
  }
  printf("c restarts              : %lu (%lu conflicts in avg)\n",*(undefined8 *)(in_RDI + 0xe8),
         local_28);
  puVar4 = Glucose::vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0xd0),0xf);
  uVar1 = *puVar4;
  puVar4 = Glucose::vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0xd0),0x10);
  printf("c blocked restarts      : %lu (multiple: %lu) \n",uVar1,*puVar4);
  puVar4 = Glucose::vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0xd0),0x11);
  printf("c last block at restart : %lu\n",*puVar4);
  puVar4 = Glucose::vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0xd0),0xd);
  printf("c nb ReduceDB           : %lu\n",*puVar4);
  puVar4 = Glucose::vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0xd0),7);
  printf("c nb removed Clauses    : %lu\n",*puVar4);
  puVar4 = Glucose::vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0xd0),10);
  printf("c nb learnts DL2        : %lu\n",*puVar4);
  puVar4 = Glucose::vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0xd0),0xb);
  printf("c nb learnts size 2     : %lu\n",*puVar4);
  puVar4 = Glucose::vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0xd0),0xc);
  printf("c nb learnts size 1     : %lu\n",*puVar4);
  if ((*(byte *)(in_RDI + 0x68) & 1) != 0) {
    puVar4 = Glucose::vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0xd0),6);
    printf("c nb permanent learnts  : %lu\n",*puVar4);
  }
  uVar2 = *(undefined8 *)(in_RDI + 0x100);
  auVar6._8_4_ = (int)((ulong)uVar2 >> 0x20);
  auVar6._0_8_ = uVar2;
  auVar6._12_4_ = 0x45300000;
  printf("c conflicts             : %-12lu   (%.0f /sec)\n",
         ((auVar6._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) / dVar5);
  uVar2 = *(undefined8 *)(in_RDI + 0xf0);
  puVar4 = Glucose::vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0xd0),0xe);
  local_34 = (float)*puVar4;
  uVar3 = *(ulong *)(in_RDI + 0xf0);
  local_6c = (float)uVar3;
  auVar8._8_4_ = (int)(uVar3 >> 0x20);
  auVar8._0_8_ = uVar3;
  auVar8._12_4_ = 0x45300000;
  printf("c decisions             : %-12lu   (%4.2f %% random) (%.0f /sec)\n",
         (double)((local_34 * 100.0) / local_6c),
         ((auVar8._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) / dVar5,uVar2);
  uVar2 = *(undefined8 *)(in_RDI + 0xf8);
  auVar7._8_4_ = (int)((ulong)uVar2 >> 0x20);
  auVar7._0_8_ = uVar2;
  auVar7._12_4_ = 0x45300000;
  printf("c propagations          : %-12lu   (%.0f /sec)\n",
         ((auVar7._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) / dVar5);
  puVar4 = Glucose::vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0xd0),9);
  printf("c nb reduced Clauses    : %lu\n",*puVar4);
  printf("c CPU time              : %g s\n",dVar5);
  return;
}

Assistant:

void printStats(Solver& solver)
{
    double cpu_time = cpuTime();
    double mem_used = 0;//memUsedPeak();
    printf("c restarts              : %" PRIu64" (%" PRIu64" conflicts in avg)\n", solver.starts,(solver.starts>0 ?solver.conflicts/solver.starts : 0));
    printf("c blocked restarts      : %" PRIu64" (multiple: %" PRIu64") \n", solver.stats[nbstopsrestarts],solver.stats[nbstopsrestartssame]);
    printf("c last block at restart : %" PRIu64"\n",solver.stats[lastblockatrestart]);
    printf("c nb ReduceDB           : %" PRIu64"\n", solver.stats[nbReduceDB]);
    printf("c nb removed Clauses    : %" PRIu64"\n",solver.stats[nbRemovedClauses]);
    printf("c nb learnts DL2        : %" PRIu64"\n", solver.stats[nbDL2]);
    printf("c nb learnts size 2     : %" PRIu64"\n", solver.stats[nbBin]);
    printf("c nb learnts size 1     : %" PRIu64"\n", solver.stats[nbUn]);
    if(solver.chanseokStrategy)
        printf("c nb permanent learnts  : %" PRIu64"\n", solver.stats[nbPermanentLearnts]);

    printf("c conflicts             : %-12" PRIu64"   (%.0f /sec)\n", solver.conflicts   , solver.conflicts   /cpu_time);
    printf("c decisions             : %-12" PRIu64"   (%4.2f %% random) (%.0f /sec)\n", solver.decisions, (float)solver.stats[rnd_decisions]*100 / (float)solver.decisions, solver.decisions   /cpu_time);
    printf("c propagations          : %-12" PRIu64"   (%.0f /sec)\n", solver.propagations, solver.propagations/cpu_time);
    //    printf("c conflict literals     : %-12" PRIu64"   (%4.2f %% deleted)\n", solver.stats[tot_literals], (solver.stats[max_literals] - solver.stats[tot_literals])*100 / (double)solver.stats[max_literals]);
    //    printf("c Average resolutions   : %-12" PRIu64"   (%.0f seen ones)\n",solver.stats[sumRes]/solver.conflicts,((double)solver.stats[sumResSeen])/solver.conflicts);
    printf("c nb reduced Clauses    : %" PRIu64"\n",solver.stats[nbReducedClauses]);

    if (mem_used != 0) printf("Memory used           : %.2f MB\n", mem_used);
    printf("c CPU time              : %g s\n", cpu_time);
}